

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QNetworkCookie>::emplace<QNetworkCookie_const&>
          (QMovableArrayOps<QNetworkCookie> *this,qsizetype i,QNetworkCookie *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  Inserter *in_RDX;
  QNetworkCookie *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QNetworkCookie tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QArrayDataPointer<QNetworkCookie>::needsDetach
                    ((QArrayDataPointer<QNetworkCookie> *)in_RDI);
  if (!(bool)uVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar4 = QArrayDataPointer<QNetworkCookie>::freeSpaceAtEnd
                          ((QArrayDataPointer<QNetworkCookie> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar4 != 0)) {
      QArrayDataPointer<QNetworkCookie>::end((QArrayDataPointer<QNetworkCookie> *)in_RDI);
      QNetworkCookie::QNetworkCookie
                ((QNetworkCookie *)in_RDI,
                 (QNetworkCookie *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceTo = (QNetworkCookie *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_001bb42a;
    }
    if ((in_RSI == (QNetworkCookie *)0x0) &&
       (qVar4 = QArrayDataPointer<QNetworkCookie>::freeSpaceAtBegin
                          ((QArrayDataPointer<QNetworkCookie> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar4 != 0)) {
      QArrayDataPointer<QNetworkCookie>::begin((QArrayDataPointer<QNetworkCookie> *)0x1bb304);
      QNetworkCookie::QNetworkCookie
                ((QNetworkCookie *)in_RDI,
                 (QNetworkCookie *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QNetworkCookie *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_001bb42a;
    }
  }
  QNetworkCookie::QNetworkCookie
            ((QNetworkCookie *)in_RDI,
             (QNetworkCookie *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar5 = in_RDI->displaceTo != (QNetworkCookie *)0x0;
  uVar6 = bVar5 && in_RSI == (QNetworkCookie *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (QNetworkCookie *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QNetworkCookie>::detachAndGrow
            ((QArrayDataPointer<QNetworkCookie> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QNetworkCookie **)
             CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar3))),
             (QArrayDataPointer<QNetworkCookie> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QNetworkCookie> *)
                              CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar3
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QNetworkCookie *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QNetworkCookie>::begin((QArrayDataPointer<QNetworkCookie> *)0x1bb3be);
    QNetworkCookie::QNetworkCookie
              ((QNetworkCookie *)in_RDI,(QNetworkCookie *)CONCAT17(uVar6,in_stack_ffffffffffffff98))
    ;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QNetworkCookie *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  QNetworkCookie::~QNetworkCookie((QNetworkCookie *)in_RDI);
LAB_001bb42a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }